

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

void pybind11::detail::traverse_offset_bases
               (void *valueptr,type_info *tinfo,instance *self,_func_bool_void_ptr_instance_ptr *f)

{
  pointer ppVar1;
  tuple_iterator tVar2;
  type_info *tinfo_00;
  pointer ppVar3;
  void *valueptr_00;
  sequence_fast_readonly sVar4;
  handle local_48;
  instance *local_40;
  _func_bool_void_ptr_instance_ptr *local_38;
  
  local_48.m_ptr = tinfo->type->tp_bases;
  local_40 = self;
  local_38 = f;
  handle::inc_ref(&local_48);
  sVar4.ptr = (PyObject **)&local_48.m_ptr[1].ob_type;
  if (((local_48.m_ptr)->ob_type->tp_flags & 0x2000000) != 0) {
    sVar4.ptr = (PyObject **)*sVar4.ptr;
  }
  tVar2 = tuple::end((tuple *)&local_48);
  do {
    if ((sequence_fast_readonly)sVar4.ptr == tVar2.super_sequence_fast_readonly.ptr) {
      handle::dec_ref(&local_48);
      return;
    }
    tinfo_00 = get_type_info((PyTypeObject *)*sVar4.ptr);
    if (tinfo_00 != (type_info *)0x0) {
      ppVar3 = (tinfo_00->implicit_casts).
               super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (tinfo_00->implicit_casts).
               super__Vector_base<std::pair<const_std::type_info_*,_void_*(*)(void_*)>,_std::allocator<std::pair<const_std::type_info_*,_void_*(*)(void_*)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar3 != ppVar1) {
        do {
          if (ppVar3->first == tinfo->cpptype) {
            valueptr_00 = (*ppVar3->second)(valueptr);
            if (valueptr_00 != valueptr) {
              (*local_38)(valueptr_00,local_40);
            }
            traverse_offset_bases(valueptr_00,tinfo_00,local_40,local_38);
            break;
          }
          ppVar3 = ppVar3 + 1;
        } while (ppVar3 != ppVar1);
      }
    }
    sVar4.ptr = sVar4.ptr + 1;
  } while( true );
}

Assistant:

inline void traverse_offset_bases(void *valueptr,
                                  const detail::type_info *tinfo,
                                  instance *self,
                                  bool (*f)(void * /*parentptr*/, instance * /*self*/)) {
    for (handle h : reinterpret_borrow<tuple>(tinfo->type->tp_bases)) {
        if (auto *parent_tinfo = get_type_info((PyTypeObject *) h.ptr())) {
            for (auto &c : parent_tinfo->implicit_casts) {
                if (c.first == tinfo->cpptype) {
                    auto *parentptr = c.second(valueptr);
                    if (parentptr != valueptr) {
                        f(parentptr, self);
                    }
                    traverse_offset_bases(parentptr, parent_tinfo, self, f);
                    break;
                }
            }
        }
    }
}